

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::mousePressEvent(QDateTimeEdit *this,QMouseEvent *event)

{
  QDateTimeEditPrivate *this_00;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((this_00->calendarPopup == true) &&
     (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QAbstractSpinBoxPrivate::updateHoverControl(&this_00->super_QAbstractSpinBoxPrivate,&local_28);
    if ((this_00->super_QAbstractSpinBoxPrivate).hoverControl == SC_ComboBoxArrow) {
      event[0xc] = (QMouseEvent)0x1;
      if (((this_00->super_QAbstractSpinBoxPrivate).field_0x3d0 & 2) == 0) {
        QDateTimeEditPrivate::updateArrow(this_00,State_Sunken);
        QDateTimeEditPrivate::initCalendarPopup(this_00,(QCalendarWidget *)0x0);
        QDateTimeEditPrivate::positionCalendarPopup(this_00);
        QWidget::show(&this_00->monthCalendar->super_QWidget);
      }
    }
    else {
      QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::mousePressEvent(QMouseEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::mousePressEvent(event);
        return;
    }
    d->updateHoverControl(event->position().toPoint());
    if (d->hoverControl == QStyle::SC_ComboBoxArrow) {
        event->accept();
        if (d->readOnly) {
            return;
        }
        d->updateArrow(QStyle::State_Sunken);
        d->initCalendarPopup();
        d->positionCalendarPopup();
        //Show the calendar
        d->monthCalendar->show();
    } else {
        QAbstractSpinBox::mousePressEvent(event);
    }
}